

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

TaprootBuilder * __thiscall TaprootBuilder::Finalize(TaprootBuilder *this,XOnlyPubKey *internal_key)

{
  pointer poVar1;
  pointer poVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  pointer merkle_root;
  long in_FS_OFFSET;
  optional<std::pair<XOnlyPubKey,_bool>_> ret;
  _Storage<std::pair<XOnlyPubKey,_bool>,_true> local_3a;
  char local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_valid == true) {
    poVar1 = (this->m_branch).
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar2 = (this->m_branch).
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)poVar2 - (long)poVar1 >> 6;
    if ((lVar6 == 0) ||
       ((lVar6 == 1 &&
        ((poVar1->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>)._M_payload.
         super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
         super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_engaged != false)))) {
      uVar3 = *(undefined8 *)(internal_key->m_keydata).super_base_blob<256U>.m_data._M_elems;
      uVar4 = *(undefined8 *)((internal_key->m_keydata).super_base_blob<256U>.m_data._M_elems + 8);
      uVar5 = *(undefined8 *)
               ((internal_key->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10)
           = *(undefined8 *)((internal_key->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10)
      ;
      *(undefined8 *)((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18)
           = uVar5;
      *(undefined8 *)(this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems = uVar3;
      *(undefined8 *)((this->m_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
           uVar4;
      merkle_root = (pointer)0x0;
      if (poVar2 != poVar1) {
        merkle_root = poVar1;
      }
      XOnlyPubKey::CreateTapTweak
                ((optional<std::pair<XOnlyPubKey,_bool>_> *)&local_3a._M_value,&this->m_internal_key
                 ,(uint256 *)merkle_root);
      if (local_19 != '\0') {
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10)
             = local_3a._16_4_;
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x14)
             = local_3a._20_4_;
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18)
             = local_3a._24_4_;
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x1c)
             = local_3a._28_4_;
        *(undefined4 *)(this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
             local_3a._0_4_;
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 4) =
             local_3a._4_4_;
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
             local_3a._8_4_;
        *(undefined4 *)((this->m_output_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0xc)
             = local_3a._12_4_;
        this->m_parity = local_3a._M_value.second;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          return this;
        }
        __stack_chk_fail();
      }
      __assert_fail("ret.has_value()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                    ,0x18b,"TaprootBuilder &TaprootBuilder::Finalize(const XOnlyPubKey &)");
    }
  }
  __assert_fail("IsComplete()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                ,0x188,"TaprootBuilder &TaprootBuilder::Finalize(const XOnlyPubKey &)");
}

Assistant:

TaprootBuilder& TaprootBuilder::Finalize(const XOnlyPubKey& internal_key)
{
    /* Can only call this function when IsComplete() is true. */
    assert(IsComplete());
    m_internal_key = internal_key;
    auto ret = m_internal_key.CreateTapTweak(m_branch.size() == 0 ? nullptr : &m_branch[0]->hash);
    assert(ret.has_value());
    std::tie(m_output_key, m_parity) = *ret;
    return *this;
}